

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ChPhysicsItem.h
# Opt level: O3

ChFrame<double> * __thiscall
chrono::ChPhysicsItem::GetVisualModelFrame
          (ChFrame<double> *__return_storage_ptr__,ChPhysicsItem *this,uint nclone)

{
  ChQuaternion<double> local_28;
  
  local_28.m_data[0] = 1.0;
  local_28.m_data[1] = 0.0;
  local_28.m_data[2] = 0.0;
  local_28.m_data[3] = 0.0;
  __return_storage_ptr__->_vptr_ChFrame = (_func_int **)&PTR__ChFrame_00b03780;
  (__return_storage_ptr__->coord).pos.m_data[0] = 0.0;
  (__return_storage_ptr__->coord).pos.m_data[1] = 0.0;
  (__return_storage_ptr__->coord).pos.m_data[2] = 0.0;
  (__return_storage_ptr__->coord).rot.m_data[0] = 1.0;
  (__return_storage_ptr__->coord).rot.m_data[1] = 0.0;
  (__return_storage_ptr__->coord).rot.m_data[2] = 0.0;
  (__return_storage_ptr__->coord).rot.m_data[3] = 0.0;
  ChMatrix33<double>::ChMatrix33(&__return_storage_ptr__->Amatrix,&local_28);
  return __return_storage_ptr__;
}

Assistant:

virtual ChFrame<> GetVisualModelFrame(unsigned int nclone = 0) { return ChFrame<>(); }